

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_115e484::SDLJoystick::~SDLJoystick(SDLJoystick *this)

{
  SDLJoystick *this_local;
  
  SDL_JoystickClose(this->joystick_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->hat_values_);
  return;
}

Assistant:

~SDLJoystick() {
			SDL_JoystickClose(joystick_);
		}